

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

ssize_t write_iso9660_data(archive_write *a,void *buff,size_t s)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  int iVar5;
  long *plVar6;
  int64_t csize;
  size_t sVar7;
  
  pvVar1 = a->format_data;
  if (*(int *)((long)pvVar1 + 8) < 0) {
    archive_set_error(&a->archive,-1,"Couldn\'t create temporary file");
    return -0x1e;
  }
  sVar7 = s;
  if ((*(int *)((long)pvVar1 + 0x40) != 0) &&
     (lVar2 = *(long *)(*(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0) + 8),
     0x1ffffe < lVar2 + s >> 0xb)) {
    sVar7 = 0xfffff800 - lVar2;
    bVar4 = *(byte *)((long)pvVar1 + 0x1d8);
    if ((bVar4 & 1) != 0) {
      zisofs_detect_magic(a,buff,sVar7);
      bVar4 = *(byte *)((long)pvVar1 + 0x1d8);
    }
    if ((bVar4 & 2) == 0) {
      iVar5 = wb_write_to_temp(a,buff,sVar7);
      if (iVar5 != 0) {
        return -0x1e;
      }
      lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0);
      csize = *(long *)(lVar2 + 8) + sVar7;
      *(int64_t *)(lVar2 + 8) = csize;
    }
    else {
      iVar5 = zisofs_write_to_temp(a,buff,sVar7);
      if (iVar5 != 0) {
        return -0x1e;
      }
      csize = *(int64_t *)(*(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0) + 8);
    }
    iVar5 = wb_write_padding_to_temp(a,csize);
    if (iVar5 != 0) {
      return -0x1e;
    }
    lVar2 = *(long *)((long)pvVar1 + 0x10);
    lVar3 = *(long *)(lVar2 + 0xb0);
    *(int *)(lVar3 + 0x10) = (int)(*(long *)(lVar3 + 8) + 0x7ffU >> 0xb);
    plVar6 = (long *)calloc(1,0x20);
    if (plVar6 == (long *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate content data");
      return -0x1e;
    }
    buff = (void *)((long)buff + sVar7);
    *plVar6 = (*(long *)((long)a->format_data + 0x102f0) - *(long *)((long)a->format_data + 0x102e0)
              ) + 0x10000;
    *(long **)(lVar3 + 0x18) = plVar6;
    *(long **)(lVar2 + 0xb0) = plVar6;
    *(undefined8 *)((long)pvVar1 + 0x240) = 0;
    sVar7 = s - sVar7;
  }
  bVar4 = *(byte *)((long)pvVar1 + 0x1d8);
  if ((bVar4 & 1) != 0) {
    zisofs_detect_magic(a,buff,sVar7);
    bVar4 = *(byte *)((long)pvVar1 + 0x1d8);
  }
  if ((bVar4 & 2) == 0) {
    iVar5 = wb_write_to_temp(a,buff,sVar7);
    if (iVar5 != 0) {
      return -0x1e;
    }
    plVar6 = (long *)(*(long *)(*(long *)((long)pvVar1 + 0x10) + 0xb0) + 8);
    *plVar6 = *plVar6 + sVar7;
  }
  else {
    iVar5 = zisofs_write_to_temp(a,buff,sVar7);
    if (iVar5 != 0) {
      return -0x1e;
    }
  }
  return s;
}

Assistant:

static ssize_t
write_iso9660_data(struct archive_write *a, const void *buff, size_t s)
{
	struct iso9660 *iso9660 = a->format_data;
	size_t ws;

	if (iso9660->temp_fd < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Couldn't create temporary file");
		return (ARCHIVE_FATAL);
	}

	ws = s;
	if (iso9660->need_multi_extent &&
	    (iso9660->cur_file->cur_content->size + ws) >=
	      (MULTI_EXTENT_SIZE - LOGICAL_BLOCK_SIZE)) {
		struct content *con;
		size_t ts;

		ts = (size_t)(MULTI_EXTENT_SIZE - LOGICAL_BLOCK_SIZE -
		    iso9660->cur_file->cur_content->size);

		if (iso9660->zisofs.detect_magic)
			zisofs_detect_magic(a, buff, ts);

		if (iso9660->zisofs.making) {
			if (zisofs_write_to_temp(a, buff, ts) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
		} else {
			if (wb_write_to_temp(a, buff, ts) != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			iso9660->cur_file->cur_content->size += ts;
		}

		/* Write padding. */
		if (wb_write_padding_to_temp(a,
		    iso9660->cur_file->cur_content->size) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);

		/* Compute the logical block number. */
		iso9660->cur_file->cur_content->blocks = (int)
		    ((iso9660->cur_file->cur_content->size
		     + LOGICAL_BLOCK_SIZE -1) >> LOGICAL_BLOCK_BITS);

		/*
		 * Make next extent.
		 */
		ws -= ts;
		buff = (const void *)(((const unsigned char *)buff) + ts);
		/* Make a content for next extent. */
		con = calloc(1, sizeof(*con));
		if (con == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate content data");
			return (ARCHIVE_FATAL);
		}
		con->offset_of_temp = wb_offset(a);
		iso9660->cur_file->cur_content->next = con;
		iso9660->cur_file->cur_content = con;
#ifdef HAVE_ZLIB_H
		iso9660->zisofs.block_offset = 0;
#endif
	}

	if (iso9660->zisofs.detect_magic)
		zisofs_detect_magic(a, buff, ws);

	if (iso9660->zisofs.making) {
		if (zisofs_write_to_temp(a, buff, ws) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	} else {
		if (wb_write_to_temp(a, buff, ws) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		iso9660->cur_file->cur_content->size += ws;
	}

	return (s);
}